

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O2

void __thiscall
aggreports::FillTVaR
          (aggreports *this,
          map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
          *tail,int summary_id,int epcalc,double nextreturnperiod_value,OASIS_FLOAT tvar)

{
  mapped_type *this_00;
  int local_14;
  TVaR local_10;
  
  local_14 = summary_id;
  this_00 = std::
            map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
            ::operator[](tail,&local_14);
  local_10.retperiod = nextreturnperiod_value;
  local_10.tvar = tvar;
  std::vector<TVaR,_std::allocator<TVaR>_>::emplace_back<TVaR>(this_00,&local_10);
  return;
}

Assistant:

void aggreports::FillTVaR(std::map<int, std::vector<TVaR>> &tail,
			  const int summary_id, const int epcalc,
			  const double nextreturnperiod_value,
			  const OASIS_FLOAT tvar) {

  tail[summary_id].push_back({nextreturnperiod_value, tvar});

}